

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

GLFWbool createShellObjects(_GLFWwindow *window)

{
  wl_surface *pwVar1;
  xdg_toplevel *pxVar2;
  xdg_wm_base *pxVar3;
  zxdg_decoration_manager_v1 *pzVar4;
  PFN_wl_proxy_marshal_flags p_Var5;
  uint32_t uVar6;
  libdecor_frame *plVar7;
  libdecor_state *plVar8;
  wl_proxy *pwVar9;
  GLFWbool GVar10;
  char *pcVar11;
  
  if (_glfw.wl.libdecor.context != (libdecor *)0x0) {
    while (_glfw.wl.libdecor.ready == 0) {
      _glfwWaitEventsWayland();
    }
    plVar7 = (*_glfw.wl.libdecor.libdecor_decorate_)
                       (_glfw.wl.libdecor.context,(window->wl).surface,&libdecorFrameInterface,
                        window);
    (window->wl).libdecor.frame = plVar7;
    if (plVar7 != (libdecor_frame *)0x0) {
      plVar8 = (*_glfw.wl.libdecor.libdecor_state_new_)((window->wl).width,(window->wl).height);
      (*_glfw.wl.libdecor.libdecor_frame_commit_)
                ((window->wl).libdecor.frame,plVar8,(libdecor_configuration *)0x0);
      (*_glfw.wl.libdecor.libdecor_state_free_)(plVar8);
      pcVar11 = (window->wl).appId;
      if (*pcVar11 != '\0') {
        (*_glfw.wl.libdecor.libdecor_frame_set_app_id_)((window->wl).libdecor.frame,pcVar11);
      }
      (*_glfw.wl.libdecor.libdecor_frame_set_title_)((window->wl).libdecor.frame,window->title);
      if ((window->minwidth != -1) && (window->minheight != -1)) {
        (*_glfw.wl.libdecor.libdecor_frame_set_min_content_size_)
                  ((window->wl).libdecor.frame,window->minwidth,window->minheight);
      }
      if ((window->maxwidth != -1) && (window->maxheight != -1)) {
        (*_glfw.wl.libdecor.libdecor_frame_set_max_content_size_)
                  ((window->wl).libdecor.frame,window->maxwidth,window->maxheight);
      }
      if (window->resizable == 0) {
        (*_glfw.wl.libdecor.libdecor_frame_unset_capabilities_)
                  ((window->wl).libdecor.frame,LIBDECOR_ACTION_RESIZE);
      }
      GVar10 = 1;
      if (window->monitor == (_GLFWmonitor *)0x0) {
        if ((window->wl).maximized != 0) {
          (*_glfw.wl.libdecor.libdecor_frame_set_maximized_)((window->wl).libdecor.frame);
        }
        GVar10 = 0;
        if (window->decorated == 0) {
          GVar10 = 0;
          (*_glfw.wl.libdecor.libdecor_frame_set_visibility_)((window->wl).libdecor.frame,false);
        }
      }
      else {
        (*_glfw.wl.libdecor.libdecor_frame_set_fullscreen_)
                  ((window->wl).libdecor.frame,(window->monitor->wl).output);
      }
      setIdleInhibitor(window,GVar10);
      (*_glfw.wl.libdecor.libdecor_frame_map_)((window->wl).libdecor.frame);
      (*_glfw.wl.client.display_roundtrip)(_glfw.wl.display);
      return 1;
    }
    _glfwInputError(0x10008,"Wayland: Failed to create libdecor frame");
  }
  p_Var5 = _glfw.wl.client.proxy_marshal_flags;
  pxVar3 = _glfw.wl.wmBase;
  pwVar1 = (window->wl).surface;
  uVar6 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.wmBase);
  pwVar9 = (*p_Var5)((wl_proxy *)pxVar3,2,&_glfw_xdg_surface_interface,uVar6,0,0,pwVar1);
  (window->wl).xdg.surface = (xdg_surface *)pwVar9;
  if (pwVar9 == (wl_proxy *)0x0) {
    pcVar11 = "Wayland: Failed to create xdg-surface for window";
  }
  else {
    (*_glfw.wl.client.proxy_add_listener)(pwVar9,(_func_void **)&xdgSurfaceListener,window);
    p_Var5 = _glfw.wl.client.proxy_marshal_flags;
    pwVar9 = (wl_proxy *)(window->wl).xdg.surface;
    uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar9);
    pwVar9 = (*p_Var5)(pwVar9,1,&_glfw_xdg_toplevel_interface,uVar6,0,0);
    (window->wl).xdg.toplevel = (xdg_toplevel *)pwVar9;
    if (pwVar9 != (wl_proxy *)0x0) {
      (*_glfw.wl.client.proxy_add_listener)(pwVar9,(_func_void **)&xdgToplevelListener,window);
      p_Var5 = _glfw.wl.client.proxy_marshal_flags;
      pcVar11 = (window->wl).appId;
      if (pcVar11 != (char *)0x0) {
        pwVar9 = (wl_proxy *)(window->wl).xdg.toplevel;
        uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar9);
        (*p_Var5)(pwVar9,3,(wl_interface *)0x0,uVar6,0,pcVar11);
      }
      xdg_toplevel_set_title((window->wl).xdg.toplevel,window->title);
      if (window->monitor == (_GLFWmonitor *)0x0) {
        GVar10 = 0;
        if ((window->wl).maximized != 0) {
          xdg_toplevel_set_maximized((window->wl).xdg.toplevel);
          GVar10 = 0;
        }
      }
      else {
        xdg_toplevel_set_fullscreen((window->wl).xdg.toplevel,(window->monitor->wl).output);
        GVar10 = 1;
      }
      setIdleInhibitor(window,GVar10);
      p_Var5 = _glfw.wl.client.proxy_marshal_flags;
      pzVar4 = _glfw.wl.decorationManager;
      if (_glfw.wl.decorationManager == (zxdg_decoration_manager_v1 *)0x0) {
        if ((window->decorated != 0) && (window->monitor == (_GLFWmonitor *)0x0)) {
          createFallbackDecorations(window);
        }
      }
      else {
        pxVar2 = (window->wl).xdg.toplevel;
        uVar6 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.decorationManager);
        pwVar9 = (*p_Var5)((wl_proxy *)pzVar4,1,&_glfw_zxdg_toplevel_decoration_v1_interface,uVar6,0
                           ,0,pxVar2);
        (window->wl).xdg.decoration = (zxdg_toplevel_decoration_v1 *)pwVar9;
        (*_glfw.wl.client.proxy_add_listener)(pwVar9,(_func_void **)&xdgDecorationListener,window);
        zxdg_toplevel_decoration_v1_set_mode
                  ((window->wl).xdg.decoration,2 - (window->decorated == 0));
      }
      updateXdgSizeLimits(window);
      wl_surface_commit((window->wl).surface);
      (*_glfw.wl.client.display_roundtrip)(_glfw.wl.display);
      return 1;
    }
    pcVar11 = "Wayland: Failed to create xdg-toplevel for window";
  }
  _glfwInputError(0x10008,pcVar11);
  return 0;
}

Assistant:

static GLFWbool createShellObjects(_GLFWwindow* window)
{
    if (_glfw.wl.libdecor.context)
    {
        if (createLibdecorFrame(window))
            return GLFW_TRUE;
    }

    return createXdgShellObjects(window);
}